

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

void menu_ensure_cursor_valid(menu *m)

{
  int iVar1;
  _Bool _Var2;
  int *piVar3;
  int cursor;
  
  piVar3 = &m->filter_count;
  if (m->filter_list == (int *)0x0) {
    piVar3 = &m->count;
  }
  iVar1 = *piVar3;
  cursor = m->cursor;
  if (cursor < iVar1) {
    do {
      _Var2 = is_valid_row(m,cursor);
      if (_Var2) goto LAB_001dbdc7;
      cursor = cursor + 1;
    } while (iVar1 != cursor);
  }
  cursor = iVar1 + -1;
LAB_001dbdc7:
  m->cursor = cursor;
  return;
}

Assistant:

void menu_ensure_cursor_valid(struct menu *m)
{
	int row;
	int count = m->filter_list ? m->filter_count : m->count;

	for (row = m->cursor; row < count; row++) {
		if (is_valid_row(m, row)) {
			m->cursor = row;
			return;
		}
	}

	/* If we've run off the end, without finding a valid row, put cursor
	 * on the last row */
	m->cursor = count - 1;
}